

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

return_of_t<std::__cxx11::basic_string<char>_(int)> * __thiscall
trompeloeil::
return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Pipe.cpp:365:5)>
::call(return_of_t<std::__cxx11::basic_string<char>_(int)> *__return_storage_ptr__,
      return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_functional_mixins_Pipe_cpp:365:5)>
      *this,trace_agent *agent,call_params_type_t<std::__cxx11::basic_string<char>_(int)> *params)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = *(params->super__Tuple_impl<0UL,_int_&>).super__Head_base<0UL,_int_&,_false>._M_head_impl;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_003f923f;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_003f923f;
      }
      if (uVar3 < 10000) goto LAB_003f923f;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_003f923f:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(__len + -((int)uVar1 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    local_70.field_2._8_8_ = local_50.field_2._8_8_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
  }
  local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
  local_70._M_string_length = local_50._M_string_length;
  trace_agent::trace_return<std::__cxx11::string>(__return_storage_ptr__,agent,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

return_of_t<Sig>
    call(
      trace_agent& agent,
      call_params_type_t<Sig>& params)
    override
    {
      return trace_return<return_of_t<Sig>>(agent, func, params);
    }